

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

char * duckdb_union_type_member_name(duckdb_logical_type type,idx_t index)

{
  string *psVar1;
  char *pcVar2;
  
  if (((type != (duckdb_logical_type)0x0) && (type[1] == (_duckdb_logical_type)0x18)) &&
     (*type == (_duckdb_logical_type)0x6b)) {
    psVar1 = duckdb::UnionType::GetMemberName_abi_cxx11_((LogicalType *)type,index);
    pcVar2 = strdup((psVar1->_M_dataplus)._M_p);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char *duckdb_union_type_member_name(duckdb_logical_type type, idx_t index) {
	if (!AssertInternalType(type, duckdb::PhysicalType::STRUCT)) {
		return nullptr;
	}
	if (!AssertLogicalTypeId(type, duckdb::LogicalTypeId::UNION)) {
		return nullptr;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	return strdup(duckdb::UnionType::GetMemberName(logical_type, index).c_str());
}